

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.hpp
# Opt level: O1

void __thiscall yactfr::internal::Vm::_continueSkipPaddingBits(Vm *this,bool contentBits)

{
  Size SVar1;
  ulong uVar2;
  ulong bitsToConsume;
  
  SVar1 = (this->_pos).remBitsToSkip;
  while (SVar1 != 0) {
    if (contentBits) {
      _requireContentBits(this,1);
    }
    else {
      _requireBits(this,1);
    }
    bitsToConsume =
         (this->_bufLenBits + this->_bufOffsetInCurPktBits) - (this->_pos).headOffsetInCurPktBits;
    uVar2 = (this->_pos).remBitsToSkip;
    if (uVar2 <= bitsToConsume) {
      bitsToConsume = uVar2;
    }
    (this->_pos).remBitsToSkip = uVar2 - bitsToConsume;
    _consumeExistingBits(this,bitsToConsume);
    SVar1 = (this->_pos).remBitsToSkip;
  }
  (this->_pos).theState = (this->_pos).nextState;
  return;
}

Assistant:

void _continueSkipPaddingBits(const bool contentBits)
    {
        while (_pos.remBitsToSkip > 0) {
            if (contentBits) {
                this->_requireContentBits(1);
            } else {
                this->_requireBits(1);
            }

            const auto bitsToSkip = std::min(_pos.remBitsToSkip, this->_remBitsInBuf());

            _pos.remBitsToSkip -= bitsToSkip;
            this->_consumeExistingBits(bitsToSkip);
        }

        // we're done now!
        _pos.state(_pos.nextState);
    }